

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

int __thiscall QAccessibleAbstractScrollArea::childCount(QAccessibleAbstractScrollArea *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  accessibleChildren((QWidgetList *)&local_30,this);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)local_30.size;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleAbstractScrollArea::childCount() const
{
    return accessibleChildren().size();
}